

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.cpp
# Opt level: O1

string * __thiscall
higan::System::RunShellCommand
          (string *__return_storage_ptr__,System *this,string *command,
          initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          args)

{
  System *pSVar1;
  char *pcVar2;
  FILE *__stream;
  string *psVar3;
  const_iterator __begin1;
  char local_458 [8];
  char buff [1024];
  System *local_50;
  string run_command;
  
  local_50 = (System *)&run_command._M_string_length;
  pSVar1 = this + 0x10;
  if (*(System **)this == pSVar1) {
    run_command._M_string_length = *(size_type *)pSVar1;
    run_command.field_2._M_allocated_capacity = *(undefined8 *)(this + 0x18);
  }
  else {
    run_command._M_string_length = *(size_type *)pSVar1;
    local_50 = *(System **)this;
  }
  run_command._M_dataplus._M_p = *(pointer *)(this + 8);
  *(System **)this = pSVar1;
  *(undefined8 *)(this + 8) = 0;
  this[0x10] = (System)0x0;
  if (args._M_array != (iterator)0x0) {
    psVar3 = command + (long)args._M_array;
    do {
      pcVar2 = (char *)std::__cxx11::string::append((char *)&local_50);
      std::__cxx11::string::_M_append(pcVar2,(ulong)(command->_M_dataplus)._M_p);
      command = command + 1;
    } while (command != psVar3);
  }
  __stream = popen((char *)local_50,"r");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while( true ) {
    pcVar2 = fgets(local_458,0x400,__stream);
    if (pcVar2 == (char *)0x0) break;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (local_50 != (System *)&run_command._M_string_length) {
    operator_delete(local_50,run_command._M_string_length + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string System::RunShellCommand(std::string command, std::initializer_list<std::string> args)
{
	std::string run_command = std::move(command);

	for (const std::string& arg : args)
	{
		run_command.append(" ").append(arg); // difference between operator+ and append
	}

	FILE* ret_stream = popen(run_command.c_str(), "r");

	char buff[1024];
	std::string result;
	while (fgets(buff, sizeof buff, ret_stream) != nullptr)
	{
		result.append(buff);
	}

	return result;
}